

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O2

void google::anon_unknown_0::InvokeDefaultSignalHandler(int signal_number)

{
  __pid_t __pid;
  _union_1457 _Stack_b8;
  sigaction sig_action;
  
  sig_action.sa_mask.__val[0xe] = 0;
  sig_action.sa_mask.__val[0xf] = 0;
  sig_action.sa_flags = 0;
  sig_action._140_4_ = 0;
  sig_action.sa_mask.__val[6] = 0;
  sig_action.sa_mask.__val[7] = 0;
  sig_action.sa_mask.__val[8] = 0;
  sig_action.sa_mask.__val[9] = 0;
  sig_action.sa_mask.__val[10] = 0;
  sig_action.sa_mask.__val[0xb] = 0;
  sig_action.sa_mask.__val[0xc] = 0;
  sig_action.sa_mask.__val[0xd] = 0;
  _Stack_b8.sa_handler = (__sighandler_t)0x0;
  sig_action.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
  sig_action.sa_mask.__val[0] = 0;
  sig_action.sa_mask.__val[1] = 0;
  sig_action.sa_mask.__val[2] = 0;
  sig_action.sa_mask.__val[3] = 0;
  sig_action.sa_mask.__val[4] = 0;
  sig_action.sa_mask.__val[5] = 0;
  sigemptyset((sigset_t *)&sig_action);
  _Stack_b8.sa_handler = (__sighandler_t)0x0;
  sigaction(signal_number,(sigaction *)&_Stack_b8,(sigaction *)0x0);
  __pid = getpid();
  kill(__pid,signal_number);
  return;
}

Assistant:

void InvokeDefaultSignalHandler(int signal_number) {
#ifdef HAVE_SIGACTION
  struct sigaction sig_action;
  memset(&sig_action, 0, sizeof(sig_action));
  sigemptyset(&sig_action.sa_mask);
  sig_action.sa_handler = SIG_DFL;
  sigaction(signal_number, &sig_action, NULL);
  kill(getpid(), signal_number);
#elif defined(GLOG_OS_WINDOWS)
  signal(signal_number, SIG_DFL);
  raise(signal_number);
#endif
}